

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::anon_unknown_15::LCSSARewriter::UseRewriter::GetOrBuildIncoming
          (UseRewriter *this,uint32_t bb_id)

{
  bool bVar1;
  BasicBlock *pBVar2;
  size_type sVar3;
  Function *pFVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar5;
  const_reference pvVar6;
  Instruction *value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *defining_blocks;
  UseRewriter *local_58;
  function<bool_(spvtools::opt::Instruction_*)> local_50;
  BasicBlock *local_30;
  BasicBlock *bb;
  Instruction **incoming_phi;
  UseRewriter *pUStack_18;
  uint32_t bb_id_local;
  UseRewriter *this_local;
  
  incoming_phi._4_4_ = bb_id;
  pUStack_18 = this;
  pBVar2 = CFG::block(this->base_->cfg_,bb_id);
  if (pBVar2 == (BasicBlock *)0x0) {
    __assert_fail("base_->cfg_->block(bb_id) != nullptr && \"Unknown basic block\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                  ,0x99,
                  "Instruction *spvtools::opt::(anonymous namespace)::LCSSARewriter::UseRewriter::GetOrBuildIncoming(uint32_t)"
                 );
  }
  bb = (BasicBlock *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
       ::operator[](&this->bb_to_phi_,(key_type *)((long)&incoming_phi + 4));
  if (bb->function_ == (Function *)0x0) {
    local_30 = CFG::block(this->base_->cfg_,incoming_phi._4_4_);
    sVar3 = std::
            unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
            ::count(this->base_->exit_bb_,&local_30);
    pBVar2 = local_30;
    if (sVar3 == 0) {
      this_00 = GetDefiningBlocks(this->base_,incoming_phi._4_4_);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
      if ((sVar5 < 2) && (incoming_phi._4_4_ != this->base_->merge_block_id_)) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
        pFVar4 = (Function *)GetOrBuildIncoming(this,*pvVar6);
        bb->function_ = pFVar4;
      }
      else {
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
        pBVar2 = local_30;
        if (sVar5 < 2) {
          if (incoming_phi._4_4_ != this->base_->merge_block_id_) {
            __assert_fail("bb_id == base_->merge_block_id_",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                          ,0xc3,
                          "Instruction *spvtools::opt::(anonymous namespace)::LCSSARewriter::UseRewriter::GetOrBuildIncoming(uint32_t)"
                         );
          }
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
          value = GetOrBuildIncoming(this,*pvVar6);
          pFVar4 = (Function *)CreatePhiInstruction(this,pBVar2,value);
          bb->function_ = pFVar4;
        }
        else {
          pFVar4 = (Function *)CreatePhiInstruction(this,local_30,this_00);
          bb->function_ = pFVar4;
        }
      }
      this_local = (UseRewriter *)bb->function_;
    }
    else {
      defining_blocks = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)bb;
      local_58 = this;
      std::function<bool(spvtools::opt::Instruction*)>::
      function<spvtools::opt::(anonymous_namespace)::LCSSARewriter::UseRewriter::GetOrBuildIncoming(unsigned_int)::_lambda(spvtools::opt::Instruction*)_1_,void>
                ((function<bool(spvtools::opt::Instruction*)> *)&local_50,
                 (anon_class_16_2_5732875f *)&defining_blocks);
      bVar1 = BasicBlock::WhileEachPhiInst(pBVar2,&local_50,false);
      std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_50);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        pFVar4 = (Function *)CreatePhiInstruction(this,local_30,this->def_insn_);
        bb->function_ = pFVar4;
        this_local = (UseRewriter *)bb->function_;
      }
      else {
        this_local = (UseRewriter *)bb->function_;
      }
    }
  }
  else {
    this_local = (UseRewriter *)bb->function_;
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction* GetOrBuildIncoming(uint32_t bb_id) {
      assert(base_->cfg_->block(bb_id) != nullptr && "Unknown basic block");

      Instruction*& incoming_phi = bb_to_phi_[bb_id];
      if (incoming_phi) {
        return incoming_phi;
      }

      BasicBlock* bb = &*base_->cfg_->block(bb_id);
      // If this is an exit basic block, look if there already is an eligible
      // phi instruction. An eligible phi has |def_insn_| as all incoming
      // values.
      if (base_->exit_bb_.count(bb)) {
        // Look if there is an eligible phi in this block.
        if (!bb->WhileEachPhiInst([&incoming_phi, this](Instruction* phi) {
              for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
                if (phi->GetSingleWordInOperand(i) != def_insn_.result_id())
                  return true;
              }
              incoming_phi = phi;
              rewritten_.insert(incoming_phi);
              return false;
            })) {
          return incoming_phi;
        }
        incoming_phi = CreatePhiInstruction(bb, def_insn_);
        return incoming_phi;
      }

      // Get the block that defines the value to use for each predecessor.
      // If the vector has 1 value, then it means that this block does not need
      // to build a phi instruction unless |bb_id| is the loop merge block.
      const std::vector<uint32_t>& defining_blocks =
          base_->GetDefiningBlocks(bb_id);

      // Special case for structured loops: merge block might be different from
      // the exit block set. To maintain structured properties it will ease
      // transformations if the merge block also holds a phi instruction like
      // the exit ones.
      if (defining_blocks.size() > 1 || bb_id == base_->merge_block_id_) {
        if (defining_blocks.size() > 1) {
          incoming_phi = CreatePhiInstruction(bb, defining_blocks);
        } else {
          assert(bb_id == base_->merge_block_id_);
          incoming_phi =
              CreatePhiInstruction(bb, *GetOrBuildIncoming(defining_blocks[0]));
        }
      } else {
        incoming_phi = GetOrBuildIncoming(defining_blocks[0]);
      }

      return incoming_phi;
    }